

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall PrintfTest_VPrintf_Test::~PrintfTest_VPrintf_Test(PrintfTest_VPrintf_Test *this)

{
  void *in_RDI;
  
  ~PrintfTest_VPrintf_Test((PrintfTest_VPrintf_Test *)0x140de8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(PrintfTest, VPrintf) {
  fmt::format_arg_store<fmt::printf_context, int> as{42};
  fmt::basic_format_args<fmt::printf_context> args(as);
  EXPECT_EQ(fmt::vsprintf("%d", args), "42");
  EXPECT_WRITE(stdout, fmt::vprintf("%d", args), "42");
  EXPECT_WRITE(stdout, fmt::vfprintf(stdout, "%d", args), "42");
  EXPECT_WRITE(stdout, fmt::vfprintf(std::cout, "%d", args), "42");
}